

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.hh
# Opt level: O1

void __thiscall Pl_AES_PDF::~Pl_AES_PDF(Pl_AES_PDF *this)

{
  uchar *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  puVar1 = (this->key)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  (this->key)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this_00 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ee0b8;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar3 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Pl_AES_PDF() final = default;